

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Reader * __thiscall
capnp::DynamicList::Reader::operator[](Reader *__return_storage_ptr__,Reader *this,uint index)

{
  double dVar1;
  byte bVar2;
  undefined2 uVar3;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  CapTableReader *pCVar7;
  ElementSize expectedElementSize;
  Which WVar8;
  StructSchema SVar9;
  ulong uVar10;
  EnumSchema EVar11;
  InterfaceSchema IVar12;
  Type TVar13;
  ArrayPtr<const_unsigned_char> AVar14;
  Fault f;
  PointerReader local_c8;
  undefined1 local_a8 [24];
  StructReader local_90;
  ListReader local_60;
  
  if ((this->reader).elementCount <= index) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              ((Fault *)&local_c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x410,FAILED,"index < size()","\"List index out-of-bounds.\"",
               (char (*) [26])"List index out-of-bounds.");
    kj::_::Debug::Fault::fatal((Fault *)&local_c8);
  }
  WVar8 = LIST;
  if ((this->schema).elementType.listDepth == '\0') {
    WVar8 = (this->schema).elementType.baseType;
  }
  switch(WVar8) {
  case VOID:
    __return_storage_ptr__->type = VOID;
    break;
  case BOOL:
    bVar2 = (this->reader).ptr[index >> 3];
    __return_storage_ptr__->type = BOOL;
    (__return_storage_ptr__->field_1).boolValue = (bVar2 >> (index & 7) & 1) != 0;
    break;
  case INT8:
    uVar10 = (ulong)(char)(this->reader).ptr[(ulong)(this->reader).step * (ulong)index >> 3];
    goto LAB_001e91c7;
  case INT16:
    uVar10 = (ulong)*(short *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3)
                              );
    goto LAB_001e91c7;
  case INT32:
    uVar10 = (ulong)*(int *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
    goto LAB_001e91c7;
  case INT64:
    uVar10 = *(ulong *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
LAB_001e91c7:
    __return_storage_ptr__->type = INT;
LAB_001e929d:
    (__return_storage_ptr__->field_1).intValue = uVar10;
    break;
  case UINT8:
    uVar10 = (ulong)(this->reader).ptr[(ulong)(this->reader).step * (ulong)index >> 3];
    goto LAB_001e9297;
  case UINT16:
    uVar10 = (ulong)*(ushort *)
                     ((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
    goto LAB_001e9297;
  case UINT32:
    uVar10 = (ulong)*(uint *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3))
    ;
    goto LAB_001e9297;
  case UINT64:
    uVar10 = *(ulong *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
LAB_001e9297:
    __return_storage_ptr__->type = UINT;
    goto LAB_001e929d;
  case FLOAT32:
    dVar1 = (double)*(float *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3)
                              );
    goto LAB_001e9275;
  case FLOAT64:
    dVar1 = *(double *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
LAB_001e9275:
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).intValue = (int64_t)dVar1;
    break;
  case TEXT:
    local_c8.pointer =
         (WirePointer *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
    local_c8.nestingLimit = (this->reader).nestingLimit;
    local_c8.segment = (this->reader).segment;
    local_c8.capTable = (this->reader).capTable;
    AVar14 = (ArrayPtr<const_unsigned_char>)
             _::PointerReader::getBlob<capnp::Text>(&local_c8,(void *)0x0,0);
    __return_storage_ptr__->type = TEXT;
    goto LAB_001e920b;
  case DATA:
    local_c8.pointer =
         (WirePointer *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
    local_c8.nestingLimit = (this->reader).nestingLimit;
    local_c8.segment = (this->reader).segment;
    local_c8.capTable = (this->reader).capTable;
    AVar14 = (ArrayPtr<const_unsigned_char>)
             _::PointerReader::getBlob<capnp::Data>(&local_c8,(void *)0x0,0);
    __return_storage_ptr__->type = DATA;
LAB_001e920b:
    (__return_storage_ptr__->field_1).dataValue.super_ArrayPtr<const_unsigned_char> = AVar14;
    break;
  case LIST:
    TVar13 = (Type)Type::asList((Type *)this);
    local_c8.pointer =
         (WirePointer *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
    local_c8.nestingLimit = (this->reader).nestingLimit;
    local_c8.segment = (this->reader).segment;
    local_c8.capTable = (this->reader).capTable;
    WVar8 = LIST;
    if (((undefined1  [16])TVar13 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
      WVar8 = TVar13.baseType;
    }
    expectedElementSize = anon_unknown_71::elementSizeFor(WVar8);
    _::PointerReader::getList(&local_60,&local_c8,expectedElementSize,(word *)0x0);
    *(StructDataBitCount *)((long)&__return_storage_ptr__->field_1 + 0x30) = local_60.structDataSize
    ;
    *(StructPointerCount *)((long)&__return_storage_ptr__->field_1 + 0x34) =
         local_60.structPointerCount;
    *(ElementSize *)((long)&__return_storage_ptr__->field_1 + 0x36) = local_60.elementSize;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = local_60._39_1_;
    *(int *)((long)&__return_storage_ptr__->field_1 + 0x38) = local_60.nestingLimit;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x3c) = local_60._44_4_;
    (__return_storage_ptr__->field_1).listValue.reader.ptr = local_60.ptr;
    *(ListElementCount *)((long)&__return_storage_ptr__->field_1 + 0x28) = local_60.elementCount;
    *(BitsPerElementN<23> *)((long)&__return_storage_ptr__->field_1 + 0x2c) = local_60.step;
    (__return_storage_ptr__->field_1).listValue.reader.segment = local_60.segment;
    (__return_storage_ptr__->field_1).listValue.reader.capTable = local_60.capTable;
    __return_storage_ptr__->type = LIST;
    (__return_storage_ptr__->field_1).listValue.schema.elementType = TVar13;
    break;
  case ENUM:
    EVar11 = Type::asEnum((Type *)this);
    uVar3 = *(undefined2 *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
    __return_storage_ptr__->type = ENUM;
    (__return_storage_ptr__->field_1).enumValue.schema.super_Schema.raw =
         (RawBrandedSchema *)EVar11.super_Schema.raw;
    *(undefined2 *)&(__return_storage_ptr__->field_1).listValue.schema.elementType.field_4 = uVar3;
    break;
  case STRUCT:
    SVar9 = Type::asStruct((Type *)this);
    _::ListReader::getStructElement(&local_90,&this->reader,index);
    *(undefined8 *)&(__return_storage_ptr__->field_1).listValue.reader.elementCount =
         local_90._32_8_;
    *(int *)((long)&__return_storage_ptr__->field_1 + 0x30) = local_90.nestingLimit;
    *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 0x34) = local_90._44_2_;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x36) = local_90._46_1_;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = local_90._47_1_;
    (__return_storage_ptr__->field_1).listValue.reader.capTable = (CapTableReader *)local_90.data;
    (__return_storage_ptr__->field_1).listValue.reader.ptr = (byte *)local_90.pointers;
    (__return_storage_ptr__->field_1).textValue.super_StringPtr.content.size_ =
         (size_t)local_90.segment;
    (__return_storage_ptr__->field_1).listValue.reader.segment = (SegmentReader *)local_90.capTable;
    __return_storage_ptr__->type = STRUCT;
    (__return_storage_ptr__->field_1).structValue.schema.super_Schema.raw =
         (RawBrandedSchema *)SVar9.super_Schema.raw;
    break;
  case INTERFACE:
    IVar12 = Type::asInterface((Type *)this);
    local_c8.pointer =
         (WirePointer *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
    local_c8.nestingLimit = (this->reader).nestingLimit;
    local_c8.segment = (this->reader).segment;
    local_c8.capTable = (this->reader).capTable;
    _::PointerReader::getCapability((PointerReader *)local_a8);
    __return_storage_ptr__->type = CAPABILITY;
    (__return_storage_ptr__->field_1).intValue = local_a8._0_8_;
    (__return_storage_ptr__->field_1).textValue.super_StringPtr.content.size_ = local_a8._8_8_;
    (__return_storage_ptr__->field_1).capabilityValue.schema.super_Schema.raw =
         (RawBrandedSchema *)IVar12.super_Schema.raw;
    break;
  case ANY_POINTER:
    uVar4 = (this->reader).step;
    iVar5 = (this->reader).nestingLimit;
    pbVar6 = (this->reader).ptr;
    __return_storage_ptr__->type = ANY_POINTER;
    pCVar7 = (this->reader).capTable;
    (__return_storage_ptr__->field_1).intValue = (int64_t)(this->reader).segment;
    (__return_storage_ptr__->field_1).textValue.super_StringPtr.content.size_ = (size_t)pCVar7;
    (__return_storage_ptr__->field_1).listValue.reader.segment =
         (SegmentReader *)(pbVar6 + ((ulong)uVar4 * (ulong)index >> 3));
    *(int *)((long)&__return_storage_ptr__->field_1 + 0x18) = iVar5;
    break;
  default:
    __return_storage_ptr__->type = UNKNOWN;
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Reader DynamicList::Reader::operator[](uint index) const {
  KJ_REQUIRE(index < size(), "List index out-of-bounds.");

  switch (schema.whichElementType()) {
#define HANDLE_TYPE(name, discrim, typeName) \
    case schema::Type::discrim: \
      return reader.getDataElement<typeName>(bounded(index) * ELEMENTS);

    HANDLE_TYPE(void, VOID, Void)
    HANDLE_TYPE(bool, BOOL, bool)
    HANDLE_TYPE(int8, INT8, int8_t)
    HANDLE_TYPE(int16, INT16, int16_t)
    HANDLE_TYPE(int32, INT32, int32_t)
    HANDLE_TYPE(int64, INT64, int64_t)
    HANDLE_TYPE(uint8, UINT8, uint8_t)
    HANDLE_TYPE(uint16, UINT16, uint16_t)
    HANDLE_TYPE(uint32, UINT32, uint32_t)
    HANDLE_TYPE(uint64, UINT64, uint64_t)
    HANDLE_TYPE(float32, FLOAT32, float)
    HANDLE_TYPE(float64, FLOAT64, double)
#undef HANDLE_TYPE

    case schema::Type::TEXT:
      return reader.getPointerElement(bounded(index) * ELEMENTS)
                   .getBlob<Text>(nullptr, ZERO * BYTES);
    case schema::Type::DATA:
      return reader.getPointerElement(bounded(index) * ELEMENTS)
                   .getBlob<Data>(nullptr, ZERO * BYTES);

    case schema::Type::LIST: {
      auto elementType = schema.getListElementType();
      return DynamicList::Reader(elementType,
          reader.getPointerElement(bounded(index) * ELEMENTS)
                .getList(elementSizeFor(elementType.whichElementType()), nullptr));
    }

    case schema::Type::STRUCT:
      return DynamicStruct::Reader(schema.getStructElementType(),
                                   reader.getStructElement(bounded(index) * ELEMENTS));

    case schema::Type::ENUM:
      return DynamicEnum(schema.getEnumElementType(),
                         reader.getDataElement<uint16_t>(bounded(index) * ELEMENTS));

    case schema::Type::ANY_POINTER:
      return AnyPointer::Reader(reader.getPointerElement(bounded(index) * ELEMENTS));

    case schema::Type::INTERFACE:
      return DynamicCapability::Client(schema.getInterfaceElementType(),
                                       reader.getPointerElement(bounded(index) * ELEMENTS)
                                             .getCapability());
  }

  return nullptr;
}